

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFFormValue.cpp
# Opt level: O3

void __thiscall
llvm::DWARFFormValue::dump(DWARFFormValue *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  bool *this_00;
  Form FVar1;
  uint64_t uVar2;
  raw_ostream *this_01;
  size_t sVar3;
  size_t __n;
  uint uVar4;
  size_t sVar5;
  uint8_t *puVar6;
  void *__buf;
  undefined8 SectionIndex;
  char *pcVar7;
  uint8_t *puVar8;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  undefined1 local_80 [8];
  Optional<llvm::object::SectionedAddress> A;
  
  uVar2 = (this->Value).field_0.uval;
  if (DumpOpts.ShowAddresses == false) {
    this_01 = nulls();
  }
  else {
    this_00 = &A.Storage.hasVal;
    WithColor::WithColor((WithColor *)this_00,OS,Address,false);
    this_01 = (raw_ostream *)A.Storage._16_8_;
    WithColor::~WithColor((WithColor *)this_00);
  }
  FVar1 = this->Form;
  if (DW_FORM_lo_user < FVar1) {
    if (FVar1 < DW_FORM_GNU_ref_alt) {
      if (FVar1 == DW_FORM_GNU_addr_index) goto switchD_00d73ee2_caseD_1b;
      if (FVar1 == DW_FORM_GNU_str_index) goto switchD_00d73ee2_caseD_1a;
      goto switchD_00d73ee2_caseD_2;
    }
    if (FVar1 == DW_FORM_GNU_ref_alt) goto LAB_00d74412;
    if (FVar1 != DW_FORM_GNU_strp_alt) goto switchD_00d73ee2_caseD_2;
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01077fc8;
      goto LAB_00d73f7e;
    }
    goto LAB_00d73f86;
  }
  uVar4 = FVar1 - 1;
  if (0x2b < uVar4) {
switchD_00d73ee2_caseD_2:
    A.Storage._16_8_ = &PTR_home_01077df8;
    goto LAB_00d74459;
  }
  switch((uint)FVar1) {
  case 1:
    SectionIndex = (this->Value).SectionIndex;
LAB_00d7420f:
    A.Storage._16_8_ = &PTR_home_01077fc8;
    raw_ostream::operator<<(this_01,(format_object_base *)&A.Storage.hasVal);
    dumpAddressSection((this->U->Context->DObj)._M_t.
                       super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                       .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl,this_01
                       ,DumpOpts,SectionIndex);
    break;
  default:
    goto switchD_00d73ee2_caseD_2;
  case 3:
  case 4:
  case 9:
  case 10:
  case 0x18:
    if (uVar2 == 0) {
      return;
    }
    switch(FVar1) {
    case DW_FORM_block2:
      A.Storage._16_8_ = &PTR_home_010780d0;
      break;
    case DW_FORM_block4:
      A.Storage._16_8_ = &PTR_home_01077fa8;
      break;
    case DW_FORM_data2:
    case DW_FORM_data4:
    case DW_FORM_data8:
    case DW_FORM_string:
      goto switchD_00d73f0b_caseD_5;
    case DW_FORM_block:
switchD_00d73f0b_caseD_9:
      A.Storage._16_8_ = &PTR_home_01077fc8;
      break;
    case DW_FORM_block1:
      A.Storage._16_8_ = &PTR_home_010780f0;
      break;
    default:
      if (FVar1 == DW_FORM_exprloc) goto switchD_00d73f0b_caseD_9;
      goto switchD_00d73f0b_caseD_5;
    }
    raw_ostream::operator<<(this_01,(format_object_base *)&A.Storage.hasVal);
switchD_00d73f0b_caseD_5:
    puVar8 = (this->Value).data;
    if (puVar8 != (uint8_t *)0x0) {
      if ((long)uVar2 < 1) {
        return;
      }
      puVar6 = puVar8 + uVar2;
      do {
        A.Storage._16_8_ = &PTR_home_010780f0;
        raw_ostream::operator<<(this_01,(format_object_base *)&A.Storage.hasVal);
        puVar8 = puVar8 + 1;
      } while (puVar8 < puVar6);
      return;
    }
    pcVar7 = "NULL";
LAB_00d74536:
    sVar5 = 4;
    goto LAB_00d7453b;
  case 5:
    A.Storage._16_8_ = &PTR_home_010780d0;
    goto LAB_00d74459;
  case 6:
    goto LAB_00d741ad;
  case 7:
    A.Storage._16_8_ = &PTR_home_01077fc8;
    goto LAB_00d74459;
  case 8:
    pcVar7 = OS->OutBufCur;
    if (pcVar7 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar7 + 1;
      *pcVar7 = '\"';
    }
    else {
      raw_ostream::write(OS,0x22,(void *)((long)&switchD_00d73ee2::switchdataD_00e5fb70 +
                                         (long)(int)(&switchD_00d73ee2::switchdataD_00e5fb70)[uVar4]
                                         ),(ulong)FVar1);
    }
    pcVar7 = (this->Value).field_0.cstr;
    if (pcVar7 == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(pcVar7);
    }
    __n = 0;
    Str_01.Length = sVar3;
    Str_01.Data = pcVar7;
    raw_ostream::write_escaped(OS,Str_01,false);
    pcVar7 = OS->OutBufCur;
    if (pcVar7 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar7 + 1;
      *pcVar7 = '\"';
    }
    else {
      raw_ostream::write(OS,0x22,__buf,__n);
    }
    break;
  case 0xb:
  case 0xc:
    A.Storage._16_8_ = &PTR_home_010780f0;
    goto LAB_00d74459;
  case 0xd:
    raw_ostream::operator<<(OS,(this->Value).field_0.sval);
    break;
  case 0xe:
    goto joined_r0x00d740aa;
  case 0xf:
    raw_ostream::operator<<(OS,(this->Value).field_0.uval);
    break;
  case 0x10:
  case 0x20:
LAB_00d74412:
    A.Storage._16_8_ = &PTR_home_01077fc8;
    OS = this_01;
    goto LAB_00d74459;
  case 0x11:
    if (DumpOpts.Verbose != true) goto LAB_00d7436c;
    A.Storage._16_8_ = &PTR_home_010780f0;
    goto LAB_00d74364;
  case 0x12:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_010780d0;
      goto LAB_00d74364;
    }
    goto LAB_00d7436c;
  case 0x13:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01077fa8;
      goto LAB_00d74364;
    }
    goto LAB_00d7436c;
  case 0x14:
    goto joined_r0x00d74197;
  case 0x15:
joined_r0x00d74197:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01077fc8;
LAB_00d74364:
      raw_ostream::operator<<(this_01,(format_object_base *)&A.Storage.hasVal);
    }
LAB_00d7436c:
    if (DumpOpts.Verbose != false) {
      Str.Length = 5;
      Str.Data = " => {";
      raw_ostream::operator<<(OS,Str);
    }
    if (DumpOpts.ShowAddresses != false) {
      WithColor::WithColor((WithColor *)local_80,OS,Address,false);
      A.Storage._16_8_ = &PTR_home_01077fc8;
      raw_ostream::operator<<((raw_ostream *)local_80,(format_object_base *)&A.Storage.hasVal);
      WithColor::~WithColor((WithColor *)local_80);
    }
    if (DumpOpts.Verbose == false) {
      return;
    }
    pcVar7 = "}";
    sVar5 = 1;
    goto LAB_00d7453b;
  case 0x16:
    pcVar7 = "DW_FORM_indirect";
    sVar5 = 0x10;
    goto LAB_00d7453b;
  case 0x17:
    A.Storage._16_8_ = &PTR_home_01077fa8;
    OS = this_01;
    goto LAB_00d74459;
  case 0x19:
    pcVar7 = "true";
    goto LAB_00d74536;
  case 0x1a:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
switchD_00d73ee2_caseD_1a:
    goto joined_r0x00d740aa;
  case 0x1b:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
switchD_00d73ee2_caseD_1b:
    if (this->U == (DWARFUnit *)0x0) {
      pcVar7 = "<invalid dwarf unit>";
      sVar5 = 0x14;
    }
    else {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)local_80,this->U,(uint32_t)uVar2);
      if ((A.Storage.field_0.value.SectionIndex._0_1_ != '\x01') || (DumpOpts.Verbose == true)) {
        A.Storage._16_8_ = &PTR_home_01077fa8;
        raw_ostream::operator<<(this_01,(format_object_base *)&A.Storage.hasVal);
      }
      SectionIndex = A.Storage.field_0.value.Address;
      if ((A.Storage.field_0.value.SectionIndex._0_1_ & 1) != 0) goto LAB_00d7420f;
      pcVar7 = "<no .debug_addr section>";
      sVar5 = 0x18;
    }
LAB_00d7453b:
    Str_00.Length = sVar5;
    Str_00.Data = pcVar7;
    raw_ostream::operator<<(OS,Str_00);
    break;
  case 0x1e:
    A.Storage._16_8_ = (this->Value).data;
    raw_ostream::operator<<(OS,(FormattedBytes *)&A.Storage.hasVal);
    break;
  case 0x1f:
joined_r0x00d740aa:
    if (DumpOpts.Verbose == true) {
      A.Storage._16_8_ = &PTR_home_01077fa8;
LAB_00d73f7e:
      raw_ostream::operator<<(OS,(format_object_base *)&A.Storage.hasVal);
    }
LAB_00d73f86:
    dumpString(this,OS);
    break;
  case 0x23:
LAB_00d741ad:
    A.Storage._16_8_ = &PTR_home_01077fa8;
LAB_00d74459:
    raw_ostream::operator<<(OS,(format_object_base *)&A.Storage.hasVal);
  }
  return;
}

Assistant:

void DWARFFormValue::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  uint64_t UValue = Value.uval;
  bool CURelativeOffset = false;
  raw_ostream &AddrOS = DumpOpts.ShowAddresses
                            ? WithColor(OS, HighlightColor::Address).get()
                            : nulls();
  switch (Form) {
  case DW_FORM_addr:
    dumpSectionedAddress(AddrOS, DumpOpts, {Value.uval, Value.SectionIndex});
    break;
  case DW_FORM_addrx:
  case DW_FORM_addrx1:
  case DW_FORM_addrx2:
  case DW_FORM_addrx3:
  case DW_FORM_addrx4:
  case DW_FORM_GNU_addr_index: {
    if (U == nullptr) {
      OS << "<invalid dwarf unit>";
      break;
    }
    Optional<object::SectionedAddress> A = U->getAddrOffsetSectionItem(UValue);
    if (!A || DumpOpts.Verbose)
      AddrOS << format("indexed (%8.8x) address = ", (uint32_t)UValue);
    if (A)
      dumpSectionedAddress(AddrOS, DumpOpts, *A);
    else
      OS << "<no .debug_addr section>";
    break;
  }
  case DW_FORM_flag_present:
    OS << "true";
    break;
  case DW_FORM_flag:
  case DW_FORM_data1:
    OS << format("0x%02x", (uint8_t)UValue);
    break;
  case DW_FORM_data2:
    OS << format("0x%04x", (uint16_t)UValue);
    break;
  case DW_FORM_data4:
    OS << format("0x%08x", (uint32_t)UValue);
    break;
  case DW_FORM_ref_sig8:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data8:
    OS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_data16:
    OS << format_bytes(ArrayRef<uint8_t>(Value.data, 16), None, 16, 16);
    break;
  case DW_FORM_string:
    OS << '"';
    OS.write_escaped(Value.cstr);
    OS << '"';
    break;
  case DW_FORM_exprloc:
  case DW_FORM_block:
  case DW_FORM_block1:
  case DW_FORM_block2:
  case DW_FORM_block4:
    if (UValue > 0) {
      switch (Form) {
      case DW_FORM_exprloc:
      case DW_FORM_block:
        AddrOS << format("<0x%" PRIx64 "> ", UValue);
        break;
      case DW_FORM_block1:
        AddrOS << format("<0x%2.2x> ", (uint8_t)UValue);
        break;
      case DW_FORM_block2:
        AddrOS << format("<0x%4.4x> ", (uint16_t)UValue);
        break;
      case DW_FORM_block4:
        AddrOS << format("<0x%8.8x> ", (uint32_t)UValue);
        break;
      default:
        break;
      }

      const uint8_t *DataPtr = Value.data;
      if (DataPtr) {
        // UValue contains size of block
        const uint8_t *EndDataPtr = DataPtr + UValue;
        while (DataPtr < EndDataPtr) {
          AddrOS << format("%2.2x ", *DataPtr);
          ++DataPtr;
        }
      } else
        OS << "NULL";
    }
    break;

  case DW_FORM_sdata:
    OS << Value.sval;
    break;
  case DW_FORM_udata:
    OS << Value.uval;
    break;
  case DW_FORM_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_line_strp:
    if (DumpOpts.Verbose)
      OS << format(" .debug_line_str[0x%8.8x] = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_strx:
  case DW_FORM_strx1:
  case DW_FORM_strx2:
  case DW_FORM_strx3:
  case DW_FORM_strx4:
  case DW_FORM_GNU_str_index:
    if (DumpOpts.Verbose)
      OS << format("indexed (%8.8x) string = ", (uint32_t)UValue);
    dumpString(OS);
    break;
  case DW_FORM_GNU_strp_alt:
    if (DumpOpts.Verbose)
      OS << format("alt indirect string, offset: 0x%" PRIx64 "", UValue);
    dumpString(OS);
    break;
  case DW_FORM_ref_addr:
    AddrOS << format("0x%016" PRIx64, UValue);
    break;
  case DW_FORM_ref1:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%2.2x", (uint8_t)UValue);
    break;
  case DW_FORM_ref2:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint16_t)UValue);
    break;
  case DW_FORM_ref4:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%4.4x", (uint32_t)UValue);
    break;
  case DW_FORM_ref8:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%8.8" PRIx64, UValue);
    break;
  case DW_FORM_ref_udata:
    CURelativeOffset = true;
    if (DumpOpts.Verbose)
      AddrOS << format("cu + 0x%" PRIx64, UValue);
    break;
  case DW_FORM_GNU_ref_alt:
    AddrOS << format("<alt 0x%" PRIx64 ">", UValue);
    break;

  // All DW_FORM_indirect attributes should be resolved prior to calling
  // this function
  case DW_FORM_indirect:
    OS << "DW_FORM_indirect";
    break;

  case DW_FORM_rnglistx:
    OS << format("indexed (0x%x) rangelist = ", (uint32_t)UValue);
    break;

  // Should be formatted to 64-bit for DWARF64.
  case DW_FORM_sec_offset:
    AddrOS << format("0x%08x", (uint32_t)UValue);
    break;

  default:
    OS << format("DW_FORM(0x%4.4x)", Form);
    break;
  }

  if (CURelativeOffset) {
    if (DumpOpts.Verbose)
      OS << " => {";
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("0x%8.8" PRIx64, UValue + (U ? U->getOffset() : 0));
    if (DumpOpts.Verbose)
      OS << "}";
  }
}